

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlNode::Clear(TiXmlNode *this)

{
  TiXmlNode *pTVar1;
  TiXmlNode *temp;
  TiXmlNode *node;
  TiXmlNode *this_local;
  
  pTVar1 = this->firstChild;
  while (temp = pTVar1, temp != (TiXmlNode *)0x0) {
    pTVar1 = temp->next;
    if (temp != (TiXmlNode *)0x0) {
      (*(temp->super_TiXmlBase)._vptr_TiXmlBase[1])();
    }
  }
  this->firstChild = (TiXmlNode *)0x0;
  this->lastChild = (TiXmlNode *)0x0;
  return;
}

Assistant:

void TiXmlNode::Clear() {
	TiXmlNode* node = firstChild;
	TiXmlNode* temp = 0;

	while (node) {
		temp = node;
		node = node->next;
		delete temp;
	}

	firstChild = 0;
	lastChild = 0;
}